

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O2

Float pbrt::FrDielectric(Float cosTheta_i,Float eta)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  
  auVar12._4_60_ = in_register_00001204;
  auVar12._0_4_ = cosTheta_i;
  auVar9 = auVar12._0_16_;
  auVar1._8_4_ = 0x7fffffff;
  auVar1._0_8_ = 0x7fffffff7fffffff;
  auVar1._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx512vl(auVar9,auVar1);
  fVar10 = 1.0;
  bVar5 = cosTheta_i < -1.0;
  auVar11 = SUB6416(ZEXT464(0x3f800000),0);
  auVar1 = vminss_avx(auVar11,auVar9);
  uVar2 = vcmpss_avx512f(auVar11,auVar9,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  fVar7 = (float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar1._0_4_);
  bVar6 = 0.0 < fVar7;
  auVar8._0_4_ = (uint)bVar6 * (int)fVar7 +
                 (uint)!bVar6 *
                 ((uint)bVar5 * 0x3f800000 +
                 (uint)!bVar5 * ((uint)bVar3 * 0x3f800000 + (uint)!bVar3 * auVar8._0_4_));
  fVar7 = (float)((uint)bVar6 * (int)eta + (uint)!bVar6 * (int)(1.0 / eta));
  auVar9 = ZEXT416((uint)fVar7);
  auVar1 = vfnmadd213ss_fma(auVar8,auVar8,auVar11);
  auVar1 = vmaxss_avx(auVar1,ZEXT816(0) << 0x40);
  auVar1 = vsqrtss_avx(auVar1,auVar1);
  auVar11._0_4_ = auVar1._0_4_ / fVar7;
  auVar11._4_12_ = auVar1._4_12_;
  if (auVar11._0_4_ < 1.0) {
    auVar1 = vfnmadd213ss_fma(auVar11,auVar11,ZEXT416(0x3f800000));
    auVar1 = vmaxss_avx(auVar1,ZEXT816(0) << 0x40);
    auVar1 = vsqrtss_avx(auVar1,auVar1);
    auVar4 = vfmsub213ss_fma(auVar8,auVar9,auVar1);
    auVar11 = vfmadd213ss_fma(auVar8,auVar9,auVar1);
    auVar13._0_4_ = auVar4._0_4_ / auVar11._0_4_;
    auVar13._4_12_ = auVar4._4_12_;
    auVar11 = vfnmadd213ss_fma(auVar1,auVar9,auVar8);
    auVar1 = vfmadd213ss_fma(auVar1,auVar9,auVar8);
    fVar10 = auVar11._0_4_ / auVar1._0_4_;
    auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar10)),auVar13,auVar13);
    fVar10 = auVar1._0_4_ * 0.5;
  }
  return fVar10;
}

Assistant:

PBRT_CPU_GPU
inline Float FrDielectric(Float cosTheta_i, Float eta) {
    cosTheta_i = Clamp(cosTheta_i, -1, 1);
    // Potentially swap indices of refraction
    bool entering = cosTheta_i > 0;
    if (!entering) {
        eta = 1 / eta;
        cosTheta_i = std::abs(cosTheta_i);
    }

    // Compute _cosTheta_t_ using Snell's law
    Float sinTheta_i = SafeSqrt(1 - cosTheta_i * cosTheta_i);
    Float sinTheta_t = sinTheta_i / eta;
    // Handle total internal reflection
    if (sinTheta_t >= 1)
        return 1;

    Float cosTheta_t = SafeSqrt(1 - sinTheta_t * sinTheta_t);

    Float r_parl = (eta * cosTheta_i - cosTheta_t) / (eta * cosTheta_i + cosTheta_t);
    Float r_perp = (cosTheta_i - eta * cosTheta_t) / (cosTheta_i + eta * cosTheta_t);
    return (r_parl * r_parl + r_perp * r_perp) / 2;
}